

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O3

void boost::throw_exception<boost::exception_detail::error_info_injector<std::runtime_error>>
               (error_info_injector<std::runtime_error> *e)

{
  clone_impl<boost::exception_detail::error_info_injector<std::runtime_error>_> *this;
  error_info_injector<std::runtime_error> local_60;
  
  this = (clone_impl<boost::exception_detail::error_info_injector<std::runtime_error>_> *)
         __cxa_allocate_exception(0x40);
  std::runtime_error::runtime_error(&local_60.super_runtime_error,&e->super_runtime_error);
  local_60.super_exception._vptr_exception = (_func_int **)&PTR___cxa_pure_virtual_00121030;
  local_60.super_exception.data_.px_ = (e->super_exception).data_.px_;
  if (local_60.super_exception.data_.px_ != (error_info_container *)0x0) {
    (**(code **)(*(long *)local_60.super_exception.data_.px_ + 0x18))();
  }
  local_60.super_exception.throw_line_ = (e->super_exception).throw_line_;
  local_60.super_exception.throw_function_ = (e->super_exception).throw_function_;
  local_60.super_exception.throw_file_ = (e->super_exception).throw_file_;
  local_60._0_8_ = &PTR__error_info_injector_00121a20;
  local_60.super_exception._vptr_exception = (_func_int **)&PTR__error_info_injector_00121a48;
  exception_detail::clone_impl<boost::exception_detail::error_info_injector<std::runtime_error>_>::
  clone_impl(this,&local_60);
  __cxa_throw(this,&exception_detail::
                    clone_impl<boost::exception_detail::error_info_injector<std::runtime_error>>::
                    typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<std::runtime_error>_>::
              ~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}